

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

void __thiscall capnp::compiler::Compiler::Node::loadFinalSchema(Node *this,SchemaLoader *loader)

{
  long lVar1;
  Maybe<capnp::schema::Node::Reader> *pMVar2;
  SegmentReader *firstElement;
  Schema SVar3;
  SegmentReader *pSVar4;
  size_t sVar5;
  Schema *ptrCopy;
  Reader *reader;
  Reader *reader_00;
  Reader local_578 [2];
  Schema local_500 [52];
  Node local_360;
  
  getContent(&local_360,(State)this);
  lVar1 = CONCAT71(local_360.super_Resolver._vptr_Resolver._1_7_,
                   local_360.super_Resolver._vptr_Resolver._0_1_);
  if (lVar1 != 0) {
    reader_00 = (Reader *)0x0;
    if (*(char *)(lVar1 + 0xa0) != '\0') {
      reader_00 = (Reader *)(lVar1 + 0xa8);
    }
    if (*(char *)(lVar1 + 0xa0) == '\x01') {
      sVar5 = *(size_t *)(lVar1 + 0xe0);
      firstElement = (SegmentReader *)
                     kj::_::HeapArrayDisposer::allocateImpl
                               (8,0,sVar5,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      local_578[0]._reader.data = &firstElement->arena + sVar5;
      local_578[0]._reader.pointers = (WirePointer *)&kj::_::HeapArrayDisposer::instance;
      pSVar4 = firstElement;
      local_578[0]._reader.segment = firstElement;
      if (*(long *)(lVar1 + 0xe0) != 0) {
        reader = *(Reader **)(lVar1 + 0xd8);
        do {
          local_578[0]._reader.capTable = (CapTableReader *)pSVar4;
          SVar3 = SchemaLoader::loadOnce(loader,reader);
          pSVar4->arena = (Arena *)SVar3.raw;
          pSVar4 = (SegmentReader *)&pSVar4->id;
          reader = reader + 1;
        } while (reader != (Reader *)(*(long *)(lVar1 + 0xe0) * 0x30 + *(long *)(lVar1 + 0xd8)));
      }
      local_578[0]._reader.capTable = (CapTableReader *)pSVar4;
      if (firstElement != (SegmentReader *)0x0) {
        sVar5 = (long)pSVar4 - (long)firstElement >> 3;
        kj::_::HeapArrayDisposer::disposeImpl
                  ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,firstElement,8,sVar5,
                   sVar5,(_func_void_void_ptr *)0x0);
      }
      local_500[0] = SchemaLoader::loadOnce(loader,reader_00);
      Schema::getProto(local_578,local_500);
      if ((this->loadedFinalSchema).ptr.isSet == true) {
        (this->loadedFinalSchema).ptr.isSet = false;
      }
      pMVar2 = &this->loadedFinalSchema;
      *(StructDataBitCount *)((long)&(pMVar2->ptr).field_1 + 0x20) = local_578[0]._reader.dataSize;
      *(StructPointerCount *)((long)&(pMVar2->ptr).field_1 + 0x24) =
           local_578[0]._reader.pointerCount;
      *(undefined2 *)((long)&(pMVar2->ptr).field_1 + 0x26) = local_578[0]._reader._38_2_;
      *(int *)((long)&(this->loadedFinalSchema).ptr.field_1 + 0x28) =
           local_578[0]._reader.nestingLimit;
      *(undefined4 *)((long)&(this->loadedFinalSchema).ptr.field_1 + 0x2c) =
           local_578[0]._reader._44_4_;
      (this->loadedFinalSchema).ptr.field_1.value._reader.data = local_578[0]._reader.data;
      (this->loadedFinalSchema).ptr.field_1.value._reader.pointers = local_578[0]._reader.pointers;
      (this->loadedFinalSchema).ptr.field_1.value._reader.segment = local_578[0]._reader.segment;
      (this->loadedFinalSchema).ptr.field_1.value._reader.capTable = local_578[0]._reader.capTable;
      (this->loadedFinalSchema).ptr.isSet = true;
    }
  }
  return;
}

Assistant:

void Compiler::Node::loadFinalSchema(const SchemaLoader& loader) {
  KJ_IF_SOME(content, getContent(Content::FINISHED)) {
    KJ_IF_SOME(exception, kj::runCatchingExceptions([&](){
      KJ_IF_SOME(finalSchema, content.finalSchema) {
        KJ_MAP(auxSchema, content.auxSchemas) {
          return loader.loadOnce(auxSchema);
        };
        loadedFinalSchema = loader.loadOnce(finalSchema).getProto();
      }
    })) {
      // Schema validation threw an exception.

      // Don't try loading this again.
      content.finalSchema = kj::none;

      // Only bother to report validation failures if we think we haven't seen any errors.
      // Otherwise we assume that the errors caused the validation failure.
      if (!module->getErrorReporter().hadErrors()) {
        addError(kj::str("Internal compiler bug: Schema failed validation:\n", exception));
      }
    }
  }
}